

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O3

void __thiscall
ParserContext::addCommit
          (ParserContext *this,TripleSymbol *sym,int4 num,uintm mask,bool flow,ConstructState *point
          )

{
  iterator __position;
  pointer pCVar1;
  ContextSet local_58;
  
  local_58.num = 0;
  local_58.mask = 0;
  local_58.value = 0;
  local_58.flow = false;
  local_58._29_3_ = 0;
  local_58.sym = (TripleSymbol *)0x0;
  local_58.point = (ConstructState *)0x0;
  __position._M_current =
       (this->contextcommit).super__Vector_base<ContextSet,_std::allocator<ContextSet>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->contextcommit).super__Vector_base<ContextSet,_std::allocator<ContextSet>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<ContextSet,_std::allocator<ContextSet>_>::_M_realloc_insert<ContextSet>
              (&this->contextcommit,__position,&local_58);
    pCVar1 = (this->contextcommit).super__Vector_base<ContextSet,_std::allocator<ContextSet>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    (__position._M_current)->num = 0;
    (__position._M_current)->mask = 0;
    (__position._M_current)->value = 0;
    (__position._M_current)->flow = false;
    *(undefined3 *)&(__position._M_current)->field_0x1d = 0;
    (__position._M_current)->sym = (TripleSymbol *)0x0;
    (__position._M_current)->point = (ConstructState *)0x0;
    pCVar1 = (this->contextcommit).super__Vector_base<ContextSet,_std::allocator<ContextSet>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
    (this->contextcommit).super__Vector_base<ContextSet,_std::allocator<ContextSet>_>._M_impl.
    super__Vector_impl_data._M_finish = pCVar1;
  }
  pCVar1[-1].sym = sym;
  pCVar1[-1].point = point;
  pCVar1[-1].num = num;
  pCVar1[-1].mask = mask;
  pCVar1[-1].value = mask & this->context[num];
  pCVar1[-1].flow = flow;
  return;
}

Assistant:

void ParserContext::addCommit(TripleSymbol *sym,int4 num,uintm mask,bool flow,ConstructState *point)

{
  contextcommit.push_back(ContextSet());
  ContextSet &set(contextcommit.back());

  set.sym = sym;
  set.point = point;		// This is the current state
  set.num = num;
  set.mask = mask;
  set.value = context[num] & mask;
  set.flow = flow;
}